

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_volumemeter.c
# Opt level: O3

void FAudioFXVolumeMeter_Process
               (FAudioFXVolumeMeter *fapo,uint32_t InputProcessParameterCount,
               FAPOProcessBufferParameters *pInputProcessParameters,
               uint32_t OutputProcessParameterCount,
               FAPOProcessBufferParameters *pOutputProcessParameters,int32_t IsEnabled)

{
  long *plVar1;
  uint uVar2;
  ulong uVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  float fVar8;
  
  plVar1 = (long *)FAPOBase_BeginProcess(&fapo->base);
  if (fapo->channels != 0) {
    uVar3 = 0;
    do {
      if (pInputProcessParameters->ValidFrameCount == 0) {
        fVar6 = 0.0;
        fVar8 = NAN;
      }
      else {
        pfVar4 = (float *)(uVar3 * 4 + (long)pInputProcessParameters->pBuffer);
        uVar2 = 0;
        fVar8 = 0.0;
        fVar5 = 0.0;
        do {
          fVar6 = (float)SDL_fabsf(*pfVar4);
          if (fVar6 <= fVar5) {
            fVar6 = fVar5;
          }
          fVar8 = fVar8 + *pfVar4 * *pfVar4;
          uVar2 = uVar2 + 1;
          pfVar4 = pfVar4 + fapo->channels;
          fVar5 = fVar6;
        } while (uVar2 < pInputProcessParameters->ValidFrameCount);
        fVar8 = fVar8 / (float)pInputProcessParameters->ValidFrameCount;
      }
      *(float *)(*plVar1 + uVar3 * 4) = fVar6;
      uVar7 = SDL_sqrtf(fVar8);
      *(undefined4 *)(plVar1[1] + uVar3 * 4) = uVar7;
      uVar3 = uVar3 + 1;
    } while (uVar3 < fapo->channels);
  }
  FAPOBase_EndProcess(&fapo->base);
  return;
}

Assistant:

void FAudioFXVolumeMeter_Process(
	FAudioFXVolumeMeter *fapo,
	uint32_t InputProcessParameterCount,
	const FAPOProcessBufferParameters* pInputProcessParameters,
	uint32_t OutputProcessParameterCount,
	FAPOProcessBufferParameters* pOutputProcessParameters,
	int32_t IsEnabled
) {
	float peak;
	float total;
	float *buffer;
	uint32_t i, j;
	FAudioFXVolumeMeterLevels *levels = (FAudioFXVolumeMeterLevels*)
		FAPOBase_BeginProcess(&fapo->base);

	/* TODO: This could probably be SIMD-ified... */
	for (i = 0; i < fapo->channels; i += 1)
	{
		peak = 0.0f;
		total = 0.0f;
		buffer = ((float*) pInputProcessParameters->pBuffer) + i;
		for (j = 0; j < pInputProcessParameters->ValidFrameCount; j += 1, buffer += fapo->channels)
		{
			const float sampleAbs = FAudio_fabsf(*buffer);
			if (sampleAbs > peak)
			{
				peak = sampleAbs;
			}
			total += (*buffer) * (*buffer);
		}
		levels->pPeakLevels[i] = peak;
		levels->pRMSLevels[i] = FAudio_sqrtf(
			total / pInputProcessParameters->ValidFrameCount
		);
	}

	FAPOBase_EndProcess(&fapo->base);
}